

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

bitset<256UL> *
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<256UL>,_void>
::as(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  error_code ec;
  error_code ec_00;
  error_code ec_01;
  bool bVar1;
  error_category *peVar2;
  conv_error *pcVar3;
  error_code *this;
  undefined8 uVar4;
  bitset<256UL> *in_RDI;
  type tVar5;
  bitset<256UL> *bs;
  size_t i;
  size_t pos;
  uint8_t mask;
  uint8_t byte;
  type result;
  string_view sv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits_1;
  type_conflict2 bits;
  size_type in_stack_fffffffffffffeb8;
  reference *in_stack_fffffffffffffec0;
  bitset<256UL> *in_stack_fffffffffffffec8;
  conv_errc __e;
  error_code *in_stack_fffffffffffffed0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  conv_error *in_stack_fffffffffffffee0;
  conv_error *this_00;
  undefined8 in_stack_fffffffffffffee8;
  error_category *in_stack_fffffffffffffef0;
  error_category *peVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  reference local_b8 [2];
  ulong local_98;
  conv_error *local_90;
  byte local_82;
  byte local_81;
  char *local_70;
  conv_errc local_68;
  string_view_type local_60 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  type_conflict2 local_10;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is<unsigned_long>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2ba906);
  if (bVar1) {
    local_10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          in_stack_fffffffffffffec0);
    std::bitset<256UL>::bitset
              ((bitset<256UL> *)in_stack_fffffffffffffed0,
               (unsigned_long_long)in_stack_fffffffffffffec8);
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string
                      (in_stack_fffffffffffffed8);
    if (!bVar1) {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        (in_stack_fffffffffffffed8);
      if (!bVar1) {
        uVar4 = __cxa_allocate_exception(0x58);
        std::error_code::error_code<jsoncons::conv_errc,void>
                  (in_stack_fffffffffffffed0,(conv_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        ec_01._M_cat = in_stack_fffffffffffffef0;
        ec_01._0_8_ = in_stack_fffffffffffffee8;
        conv_error::conv_error(in_stack_fffffffffffffee0,ec_01);
        __cxa_throw(uVar4,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    std::bitset<256UL>::bitset((bitset<256UL> *)0x2ba969);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2ba976);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string
                      (in_stack_fffffffffffffed8);
    if (bVar1) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffec8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec8)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0)
      ;
    }
    else {
      local_60[0] = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                              (in_stack_ffffffffffffff20);
      std::basic_string_view<char,_std::char_traits<char>_>::begin(local_60);
      std::basic_string_view<char,_std::char_traits<char>_>::end(local_60);
      tVar5 = decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((char *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffed0);
      local_70 = tVar5.it;
      local_68 = tVar5.ec;
      if (local_68 != success) {
        peVar2 = (error_category *)__cxa_allocate_exception(0x58);
        peVar6 = peVar2;
        std::error_code::error_code<jsoncons::conv_errc,void>
                  (in_stack_fffffffffffffed0,(conv_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        ec._M_cat = peVar6;
        ec._0_8_ = peVar2;
        conv_error::conv_error(in_stack_fffffffffffffee0,ec);
        __cxa_throw(peVar2,&conv_error::typeinfo,conv_error::~conv_error);
      }
      local_68 = 0;
    }
    local_81 = 0;
    local_82 = 0;
    local_90 = (conv_error *)0x0;
    for (local_98 = 0; local_98 < 0x100; local_98 = local_98 + 1) {
      if (local_82 == 0) {
        this_00 = local_90;
        pcVar3 = (conv_error *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_28);
        __e = (conv_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        if (pcVar3 <= this_00) {
          this = (error_code *)__cxa_allocate_exception(0x58);
          std::error_code::error_code<jsoncons::conv_errc,void>(this,__e);
          ec_00._M_cat = in_stack_fffffffffffffef0;
          ec_00._0_8_ = in_stack_fffffffffffffee8;
          conv_error::conv_error(this_00,ec_00);
          __cxa_throw(this,&conv_error::typeinfo,conv_error::~conv_error);
        }
        local_90 = (conv_error *)&local_90->field_0x1;
        in_stack_fffffffffffffec8 =
             (bitset<256UL> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        local_81 = (byte)(in_stack_fffffffffffffec8->super__Base_bitset<4UL>)._M_w[0];
        local_82 = 0x80;
      }
      if ((local_81 & local_82) != 0) {
        std::bitset<256UL>::operator[](in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
        std::bitset<256UL>::reference::operator=
                  (in_stack_fffffffffffffec0,SUB81(in_stack_fffffffffffffeb8 >> 0x38,0));
        std::bitset<256UL>::reference::~reference(local_b8);
      }
      local_82 = (byte)((int)(uint)local_82 >> 1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0);
  }
  return in_RDI;
}

Assistant:

static std::bitset<N> as(const Json& j)
        {
            if (j.template is<uint64_t>())
            {
                auto bits = j.template as<uint64_t>();
                std::bitset<N> bs = static_cast<unsigned long long>(bits);
                return bs;
            }
            else if (j.is_byte_string() || j.is_string())
            {
                std::bitset<N> bs;
                std::vector<uint8_t> bits;
                if (j.is_byte_string())
                {
                    bits = j.template as<std::vector<uint8_t>>();
                }
                else
                {
                    jsoncons::string_view sv = j.as_string_view();
                    auto result = decode_base16(sv.begin(), sv.end(), bits);
                    if (result.ec != conv_errc::success)
                    {
                        JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                    }
                }
                std::uint8_t byte = 0;
                std::uint8_t mask  = 0;

                std::size_t pos = 0;
                for (std::size_t i = 0; i < N; ++i)
                {
                    if (mask == 0)
                    {
                        if (pos >= bits.size())
                        {
                            JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                        }
                        byte = bits.at(pos++);
                        mask = 0x80;
                    }

                    if (byte & mask)
                    {
                        bs[i] = 1;
                    }

                    mask = static_cast<std::uint8_t>(mask >> 1);
                }
                return bs;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_bitset));
            }
        }